

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# led_impl.cpp
# Opt level: O2

void __thiscall ui::LedPanel::LedPanel(LedPanel *this)

{
  Component *this_00;
  ComponentBase *this_01;
  long lVar1;
  pointer pbVar2;
  ConstStringListRef entries;
  initializer_list<std::shared_ptr<ftxui::ComponentBase>_> __l;
  undefined1 local_198 [40];
  __shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *local_170;
  Component local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  local_120;
  Components local_108;
  Ref<ftxui::RadioboxOption> local_e8;
  
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.parent_ = (ComponentBase *)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase.children_.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PanelBase).super_ComponentBase._vptr_ComponentBase =
       (_func_int **)&PTR__LedPanel_001674b8;
  this->selected_led_ = 0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ftxui::Ref<ftxui::RadioboxOption>::Ref(&local_e8);
  local_170 = &(this->radiobox_).
               super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>;
  entries.ref_wide_ =
       (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        *)&this->names_;
  entries.ref_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_170;
  ftxui::Radiobox(entries,(int *)0x0,(Ref<ftxui::RadioboxOption> *)&this->selected_led_);
  ftxui::RadioboxOption::~RadioboxOption(&local_e8.owned_);
  this_00 = &this->led_tab_;
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.
  super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ftxui::Container::Tab((Container *)this_00,&local_108,&this->selected_led_);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_108);
  FindLEDs_abi_cxx11_();
  for (pbVar2 = local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 != local_158.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
    std::__cxx11::string::string((string *)&name,(string *)pbVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->names_,&name);
    this_01 = (this_00->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::make_shared<ui::Led,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198);
    local_198._16_8_ = local_198._0_8_;
    local_198._24_8_ = local_198._8_8_;
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = 0;
    ftxui::ComponentBase::Add(this_01,(Component *)(local_198 + 0x10));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8));
    std::__cxx11::string::~string((string *)&name);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&name,local_170);
  std::__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2> *)&name.field_2,
             &this_00->super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 2;
  __l._M_array = (iterator)&name;
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::vector(&local_120,__l,(allocator_type *)&local_158);
  ftxui::Container::Vertical((Container *)&local_168,&local_120);
  ftxui::ComponentBase::Add((ComponentBase *)this,&local_168);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_168.super___shared_ptr<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::
  vector<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
  ::~vector(&local_120);
  lVar1 = 0x18;
  do {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&name._M_dataplus._M_p + lVar1))
    ;
    lVar1 = lVar1 + -0x10;
  } while (lVar1 != -8);
  return;
}

Assistant:

LedPanel() {
    for (auto name : FindLEDs()) {
      names_.push_back(name);
      led_tab_->Add(Make<Led>(name));
    }

    Add(Container::Vertical({
        radiobox_,
        led_tab_,
    }));
  }